

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rattle.cpp
# Opt level: O3

int __thiscall OpenMD::Rattle::constraintPairA(Rattle *this,ConstraintPair *consPair)

{
  double *pdVar1;
  ConstraintElem *pCVar2;
  ConstraintElem *pCVar3;
  StuntDouble *pSVar4;
  StuntDouble *pSVar5;
  double dVar6;
  uint i;
  int iVar7;
  long lVar8;
  uint i_7;
  uint i_4;
  double tmp;
  double dVar9;
  double dVar10;
  double tmp_1;
  Vector<double,_3U> result_1;
  Vector<double,_3U> result_5;
  Vector<double,_3U> result_2;
  Vector<double,_3U> result_6;
  Vector<double,_3U> result;
  Vector<double,_3U> result_8;
  double local_188 [4];
  double local_168 [4];
  double local_148 [4];
  double local_128 [4];
  double local_108 [4];
  double local_e8 [4];
  double local_c8 [4];
  double local_a8 [4];
  Vector3d local_88;
  double local_68;
  undefined8 uStack_60;
  double local_58 [4];
  Vector3d local_38;
  
  pCVar2 = consPair->consElem1_;
  pCVar3 = consPair->consElem2_;
  pSVar4 = pCVar2->sd_;
  lVar8 = *(long *)((long)&(pSVar4->snapshotMan_->currentSnapshot_->atomData).position.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data + pSVar4->storage_);
  local_c8[2] = (double)*(undefined8 *)(lVar8 + 0x10 + (long)pSVar4->localIndex_ * 0x18);
  pdVar1 = (double *)(lVar8 + (long)pSVar4->localIndex_ * 0x18);
  local_c8[0] = *pdVar1;
  local_c8[1] = pdVar1[1];
  pSVar4 = pCVar3->sd_;
  lVar8 = *(long *)((long)&(pSVar4->snapshotMan_->currentSnapshot_->atomData).position.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + pSVar4->storage_);
  local_e8[2] = (double)*(undefined8 *)(lVar8 + 0x10 + (long)pSVar4->localIndex_ * 0x18);
  pdVar1 = (double *)(lVar8 + (long)pSVar4->localIndex_ * 0x18);
  local_e8[0] = *pdVar1;
  local_e8[1] = pdVar1[1];
  local_108[0] = 0.0;
  local_108[1] = 0.0;
  local_108[2] = 0.0;
  lVar8 = 0;
  do {
    local_108[lVar8] = local_c8[lVar8] - local_e8[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  local_38.super_Vector<double,_3U>.data_[2] = local_108[2];
  local_38.super_Vector<double,_3U>.data_[0] = local_108[0];
  local_38.super_Vector<double,_3U>.data_[1] = local_108[1];
  Snapshot::wrapVector(this->currentSnapshot_,&local_38);
  local_68 = 0.0;
  lVar8 = 0;
  do {
    dVar10 = local_38.super_Vector<double,_3U>.data_[lVar8];
    local_68 = local_68 + dVar10 * dVar10;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  local_c8[3] = consPair->dist2;
  local_68 = local_c8[3] - local_68;
  dVar10 = this->consTolerance_ * local_c8[3];
  iVar7 = 1;
  if (dVar10 + dVar10 < ABS(local_68)) {
    uStack_60 = 0;
    pSVar4 = pCVar2->sd_;
    lVar8 = *(long *)((long)&(pSVar4->snapshotMan_->previousSnapshot_->atomData).position.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data + pSVar4->storage_);
    local_108[2] = (double)*(undefined8 *)(lVar8 + 0x10 + (long)pSVar4->localIndex_ * 0x18);
    pdVar1 = (double *)(lVar8 + (long)pSVar4->localIndex_ * 0x18);
    local_108[0] = *pdVar1;
    local_108[1] = pdVar1[1];
    pSVar4 = pCVar3->sd_;
    lVar8 = *(long *)((long)&(pSVar4->snapshotMan_->previousSnapshot_->atomData).position.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + pSVar4->storage_);
    local_58[2] = (double)*(undefined8 *)(lVar8 + 0x10 + (long)pSVar4->localIndex_ * 0x18);
    pdVar1 = (double *)(lVar8 + (long)pSVar4->localIndex_ * 0x18);
    local_58[0] = *pdVar1;
    local_58[1] = pdVar1[1];
    local_188[0] = 0.0;
    local_188[1] = 0.0;
    local_188[2] = 0.0;
    lVar8 = 0;
    do {
      local_188[lVar8] = local_108[lVar8] - local_58[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    local_88.super_Vector<double,_3U>.data_[2] = local_188[2];
    local_88.super_Vector<double,_3U>.data_[0] = local_188[0];
    local_88.super_Vector<double,_3U>.data_[1] = local_188[1];
    Snapshot::wrapVector(this->currentSnapshot_,&local_88);
    dVar10 = 0.0;
    lVar8 = 0;
    do {
      dVar10 = dVar10 + local_88.super_Vector<double,_3U>.data_[lVar8] *
                        local_38.super_Vector<double,_3U>.data_[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    iVar7 = -1;
    if (local_c8[3] * -local_68 <= dVar10 * dVar10) {
      pSVar4 = pCVar2->sd_;
      dVar6 = 1.0 / pSVar4->mass_;
      pSVar5 = pCVar3->sd_;
      dVar9 = 1.0 / pSVar5->mass_;
      local_148[0] = 0.0;
      local_148[1] = 0.0;
      local_148[2] = 0.0;
      lVar8 = 0;
      do {
        local_148[lVar8] =
             local_88.super_Vector<double,_3U>.data_[lVar8] *
             (local_68 / (dVar10 * (dVar6 + dVar9 + dVar6 + dVar9)));
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar8 = 0;
      do {
        local_188[lVar8] = local_148[lVar8] * dVar6;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      lVar8 = 0;
      do {
        local_c8[lVar8] = local_188[lVar8] + local_c8[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      iVar7 = pSVar4->localIndex_;
      lVar8 = *(long *)((long)&(pSVar4->snapshotMan_->currentSnapshot_->atomData).position.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data + pSVar4->storage_);
      *(double *)(lVar8 + 0x10 + (long)iVar7 * 0x18) = local_c8[2];
      pdVar1 = (double *)(lVar8 + (long)iVar7 * 0x18);
      *pdVar1 = local_c8[0];
      pdVar1[1] = local_c8[1];
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      lVar8 = 0;
      do {
        local_188[lVar8] = local_148[lVar8] * dVar9;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      lVar8 = 0;
      do {
        local_e8[lVar8] = local_e8[lVar8] - local_188[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      iVar7 = pSVar5->localIndex_;
      lVar8 = *(long *)((long)&(pSVar5->snapshotMan_->currentSnapshot_->atomData).position.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + pSVar5->storage_);
      *(double *)(lVar8 + 0x10 + (long)iVar7 * 0x18) = local_e8[2];
      pdVar1 = (double *)(lVar8 + (long)iVar7 * 0x18);
      *pdVar1 = local_e8[0];
      pdVar1[1] = local_e8[1];
      dVar10 = this->dt_;
      lVar8 = 0;
      do {
        local_148[lVar8] = local_148[lVar8] / dVar10;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      pSVar4 = pCVar2->sd_;
      pdVar1 = (double *)
               (*(long *)((long)&(pSVar4->snapshotMan_->currentSnapshot_->atomData).velocity.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data + pSVar4->storage_) +
               (long)pSVar4->localIndex_ * 0x18);
      local_188[2] = pdVar1[2];
      local_188[0] = *pdVar1;
      local_188[1] = pdVar1[1];
      local_168[0] = 0.0;
      local_168[1] = 0.0;
      local_168[2] = 0.0;
      lVar8 = 0;
      do {
        local_168[lVar8] = local_148[lVar8] * dVar6;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      lVar8 = 0;
      do {
        local_188[lVar8] = local_168[lVar8] + local_188[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      pdVar1[2] = local_188[2];
      *pdVar1 = local_188[0];
      pdVar1[1] = local_188[1];
      pSVar4 = pCVar3->sd_;
      pdVar1 = (double *)
               (*(long *)((long)&(pSVar4->snapshotMan_->currentSnapshot_->atomData).velocity.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + pSVar4->storage_) +
               (long)pSVar4->localIndex_ * 0x18);
      local_168[2] = pdVar1[2];
      local_168[0] = *pdVar1;
      local_168[1] = pdVar1[1];
      local_128[0] = 0.0;
      local_128[1] = 0.0;
      local_128[2] = 0.0;
      lVar8 = 0;
      do {
        local_128[lVar8] = local_148[lVar8] * dVar9;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      lVar8 = 0;
      do {
        local_168[lVar8] = local_168[lVar8] - local_128[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      pdVar1[2] = local_168[2];
      *pdVar1 = local_168[0];
      pdVar1[1] = local_168[1];
      local_128[0] = 0.0;
      local_128[1] = 0.0;
      local_128[2] = 0.0;
      lVar8 = 0;
      do {
        local_128[lVar8] = local_148[lVar8] + local_148[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      dVar10 = this->dt_;
      local_a8[0] = 0.0;
      local_a8[1] = 0.0;
      local_a8[2] = 0.0;
      lVar8 = 0;
      do {
        local_a8[lVar8] = local_128[lVar8] / dVar10;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      dVar10 = 0.0;
      lVar8 = 0;
      do {
        dVar10 = dVar10 + local_a8[lVar8] * local_a8[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      if (dVar10 < 0.0) {
        dVar10 = sqrt(dVar10);
      }
      else {
        dVar10 = SQRT(dVar10);
      }
      dVar6 = 0.0;
      lVar8 = 0;
      do {
        dVar6 = dVar6 + local_a8[lVar8] * local_88.super_Vector<double,_3U>.data_[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      consPair->force_ =
           (double)((ulong)ABS(dVar10) | (ulong)dVar6 & 0x8000000000000000) + consPair->force_;
      iVar7 = 0;
    }
  }
  return iVar7;
}

Assistant:

int Rattle::constraintPairA(ConstraintPair* consPair) {
    ConstraintElem* consElem1 = consPair->getConsElem1();
    ConstraintElem* consElem2 = consPair->getConsElem2();

    Vector3d posA = consElem1->getPos();
    Vector3d posB = consElem2->getPos();

    Vector3d pab = posA - posB;

    // periodic boundary condition

    currentSnapshot_->wrapVector(pab);

    RealType pabsq = pab.lengthSquare();

    RealType rabsq  = consPair->getConsDistSquare();
    RealType diffsq = rabsq - pabsq;

    // the original rattle code from alan tidesley
    if (fabs(diffsq) > (consTolerance_ * rabsq * 2.0)) {
      Vector3d oldPosA = consElem1->getPrevPos();
      Vector3d oldPosB = consElem2->getPrevPos();

      Vector3d rab = oldPosA - oldPosB;

      currentSnapshot_->wrapVector(rab);

      RealType rpab   = dot(rab, pab);
      RealType rpabsq = rpab * rpab;

      if (rpabsq < (rabsq * -diffsq)) { return consFail; }

      RealType rma = 1.0 / consElem1->getMass();
      RealType rmb = 1.0 / consElem2->getMass();

      RealType gab = diffsq / (2.0 * (rma + rmb) * rpab);

      Vector3d delta = rab * gab;

      // set atom1's position
      posA += rma * delta;
      consElem1->setPos(posA);

      // set atom2's position
      posB -= rmb * delta;
      consElem2->setPos(posB);

      delta /= dt_;

      // set atom1's velocity
      Vector3d velA = consElem1->getVel();
      velA += rma * delta;
      consElem1->setVel(velA);

      // set atom2's velocity
      Vector3d velB = consElem2->getVel();
      velB -= rmb * delta;
      consElem2->setVel(velB);

      // report the constraint force back to the constraint pair:
      Vector3d fcons = 2.0 * delta / dt_;
      RealType proj  = copysign(fcons.length(), dot(fcons, rab));

      consPair->addConstraintForce(proj);
      return consSuccess;
    } else {
      return consAlready;
    }
  }